

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

void __thiscall
glcts::PipelineApiCase::checkProgInfoLog(PipelineApiCase *this,Functions *gl,GLuint pipeline)

{
  int iVar1;
  GLenum GVar2;
  TestError *this_00;
  int iVar3;
  GLsizei length;
  GLint value;
  vector<char,_std::allocator<char>_> infoLogBuf;
  int local_44;
  allocator_type local_3d;
  int local_3c;
  vector<char,_std::allocator<char>_> local_38;
  
  (*gl->getProgramPipelineiv)(pipeline,0x8b84,&local_3c);
  std::vector<char,_std::allocator<char>_>::vector(&local_38,(long)(local_3c + 1),&local_3d);
  (*gl->getProgramPipelineInfoLog)
            (pipeline,0,&local_44,
             local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"GetProgramPipelineInfoLog failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0x370);
  iVar1 = local_3c;
  iVar3 = local_3c / 2;
  (*gl->getProgramPipelineInfoLog)
            (pipeline,iVar3,&local_44,
             local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((iVar1 + 1U < 3) || (iVar3 == local_44 + 1)) {
    (*gl->getProgramPipelineInfoLog)
              (pipeline,local_3c,&local_44,
               local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    if ((local_3c == 0) || (local_3c == local_44 + 1)) {
      (*gl->getProgramPipelineInfoLog)
                (pipeline + 0x65,local_3c,&local_44,
                 local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      GVar2 = (*gl->getError)();
      if (GVar2 == 0x501) {
        if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (GLchar *)0x0) {
          operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        return;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"GetProgramPipelineInfoLog failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x385);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"GetProgramPipelineInfoLog failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                 ,0x37c);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"GetProgramPipelineInfoLog failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x376);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void checkProgInfoLog(const glw::Functions& gl, GLuint pipeline)
	{
		glw::GLint   value;
		glw::GLsizei bufSize;
		glw::GLsizei length;
		glw::GLenum  err;

		gl.getProgramPipelineiv(pipeline, GL_INFO_LOG_LENGTH, &value);
		std::vector<char> infoLogBuf(value + 1);

		bufSize = 0;
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramPipelineInfoLog failed");

		bufSize = value / 2; // read half the log
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		if ((bufSize != 0) && (bufSize != length + 1))
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}
		bufSize = value;
		gl.getProgramPipelineInfoLog(pipeline, bufSize, &length, &infoLogBuf[0]);
		if ((bufSize != 0) && (bufSize != length + 1))
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}

		// Negative case for GetProgramPipelineInfoLog

		gl.getProgramPipelineInfoLog(pipeline + 101, bufSize, &length, &infoLogBuf[0]);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("GetProgramPipelineInfoLog failed");
		}
	}